

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

bool __thiscall BanMan::Unban(BanMan *this,CSubNet *sub_net)

{
  size_type sVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  unique_lock<std::mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&uStack_28,&this->m_banned_mutex,
             "m_banned_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
             ,0xa5,false);
  sVar1 = std::
          _Rb_tree<CSubNet,_std::pair<const_CSubNet,_CBanEntry>,_std::_Select1st<std::pair<const_CSubNet,_CBanEntry>_>,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
          ::erase(&(this->m_banned)._M_t,sub_net);
  if (sVar1 == 0) {
    std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  }
  else {
    this->m_is_dirty = true;
    std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
    if (this->m_client_interface != (CClientUIInterface *)0x0) {
      CClientUIInterface::BannedListChanged(this->m_client_interface);
    }
    DumpBanlist(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return sVar1 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool BanMan::Unban(const CSubNet& sub_net)
{
    {
        LOCK(m_banned_mutex);
        if (m_banned.erase(sub_net) == 0) return false;
        m_is_dirty = true;
    }
    if (m_client_interface) m_client_interface->BannedListChanged();
    DumpBanlist(); //store banlist to disk immediately
    return true;
}